

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

realtype N_VL1Norm_Serial(N_Vector x)

{
  long lVar1;
  long lVar2;
  realtype rVar3;
  
  lVar1 = *x->content;
  lVar2 = 0;
  if (lVar1 < 1) {
    lVar1 = lVar2;
  }
  rVar3 = 0.0;
  for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    rVar3 = rVar3 + ABS(*(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8));
  }
  return rVar3;
}

Assistant:

realtype N_VL1Norm_Serial(N_Vector x)
{
  sunindextype i, N;
  realtype sum, *xd;

  sum = ZERO;
  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i<N; i++)
    sum += SUNRabs(xd[i]);

  return(sum);
}